

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

CURLcode Curl_conn_cf_cntrl(Curl_cfilter *cf,Curl_easy *data,_Bool ignore_result,int event,int arg1,
                           void *arg2)

{
  Curl_cft_cntrl *pCVar1;
  CURLcode result;
  CURLcode CVar2;
  
  CVar2 = CURLE_OK;
  do {
    if (cf == (Curl_cfilter *)0x0) {
      return CVar2;
    }
    pCVar1 = cf->cft->cntrl;
    if (pCVar1 != Curl_cf_def_cntrl) {
      CVar2 = (*pCVar1)(cf,data,event,arg1,arg2);
      if ((!ignore_result) && (CVar2 != CURLE_OK)) {
        return CVar2;
      }
    }
    cf = cf->next;
  } while( true );
}

Assistant:

CURLcode Curl_conn_cf_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            bool ignore_result,
                            int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;

  for(; cf; cf = cf->next) {
    if(Curl_cf_def_cntrl == cf->cft->cntrl)
      continue;
    result = cf->cft->cntrl(cf, data, event, arg1, arg2);
    if(!ignore_result && result)
      break;
  }
  return result;
}